

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

void InsNew(PProfileList list,PProfile_conflict profile)

{
  Long x;
  PProfile_conflict current;
  PProfile_conflict *old;
  PProfile_conflict profile_local;
  PProfileList list_local;
  
  x = (Long)*list;
  current = (PProfile_conflict)list;
  while ((x != 0 && (*(long *)x <= profile->X))) {
    current = (PProfile_conflict)(x + 8);
    x = current->X;
  }
  profile->link = (PProfile)x;
  current->X = (FT_F26Dot6)profile;
  return;
}

Assistant:

static void
  InsNew( PProfileList  list,
          PProfile      profile )
  {
    PProfile  *old, current;
    Long       x;


    old     = list;
    current = *old;
    x       = profile->X;

    while ( current )
    {
      if ( x < current->X )
        break;
      old     = &current->link;
      current = *old;
    }

    profile->link = current;
    *old          = profile;
  }